

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_command_queue_mode_t mode)

{
  int in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  __cxx11 local_48 [34];
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  ze_command_queue_mode_t mode_local;
  
  this = (string *)CONCAT44(in_register_0000003c,mode);
  psStack_10 = this;
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_COMMAND_QUEUE_MODE_DEFAULT",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_COMMAND_QUEUE_MODE_SYNCHRONOUS",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::__cxx11::to_string(local_48,in_ESI);
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unknown ze_command_queue_mode_t value: ");
    std::__cxx11::string::~string((string *)local_48);
  }
  return this;
}

Assistant:

std::string to_string(const ze_command_queue_mode_t mode) {
  if (mode == ZE_COMMAND_QUEUE_MODE_DEFAULT) {
    return "ZE_COMMAND_QUEUE_MODE_DEFAULT";
  } else if (mode == ZE_COMMAND_QUEUE_MODE_SYNCHRONOUS) {
    return "ZE_COMMAND_QUEUE_MODE_SYNCHRONOUS";
  } else if (mode == ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS) {
    return "ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS";
  } else {
    return "Unknown ze_command_queue_mode_t value: " +
           std::to_string(static_cast<int>(mode));
  }
}